

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Delaunay_psm.cpp
# Opt level: O2

bool __thiscall
anon_unknown.dwarf_5db41::FileSystemRootNode::get_directory_entries
          (FileSystemRootNode *this,string *path,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *result)

{
  bool bVar1;
  int iVar2;
  DIR *__dirp;
  dirent *pdVar3;
  ostream *poVar4;
  string dirname;
  string current;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  std::__cxx11::string::string((string *)&local_90,(string *)path);
  if (local_90._M_dataplus._M_p[local_90._M_string_length - 1] != '/') {
    std::__cxx11::string::append((char *)&local_90);
  }
  __dirp = opendir(local_90._M_dataplus._M_p);
  if (__dirp == (DIR *)0x0) {
    std::__cxx11::string::string((string *)&local_70,"OS",(allocator *)&local_50);
    poVar4 = GEO::Logger::err(&local_70);
    poVar4 = std::operator<<(poVar4,"Could not open directory ");
    poVar4 = std::operator<<(poVar4,(string *)&local_90);
    std::endl<char,std::char_traits<char>>(poVar4);
    std::__cxx11::string::~string((string *)&local_70);
  }
  else {
    pdVar3 = readdir(__dirp);
    while (pdVar3 != (dirent *)0x0) {
      std::__cxx11::string::string((string *)&local_70,pdVar3->d_name,(allocator *)&local_50);
      bVar1 = std::operator!=(&local_70,".");
      if (bVar1) {
        bVar1 = std::operator!=(&local_70,"..");
        if (bVar1) {
          bVar1 = std::operator!=(&local_90,"./");
          if (bVar1) {
            std::operator+(&local_50,&local_90,&local_70);
            std::__cxx11::string::operator=((string *)&local_70,(string *)&local_50);
            std::__cxx11::string::~string((string *)&local_50);
          }
          iVar2 = (*(this->super_Node).super_Counted._vptr_Counted[2])(this,&local_70);
          if ((char)iVar2 == '\0') {
            iVar2 = (*(this->super_Node).super_Counted._vptr_Counted[3])(this,&local_70);
            if ((char)iVar2 == '\0') goto LAB_0016344a;
          }
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back(result,&local_70);
        }
      }
LAB_0016344a:
      pdVar3 = readdir(__dirp);
      std::__cxx11::string::~string((string *)&local_70);
    }
    closedir(__dirp);
  }
  std::__cxx11::string::~string((string *)&local_90);
  return __dirp != (DIR *)0x0;
}

Assistant:

bool get_directory_entries(
            const std::string& path, std::vector<std::string>& result
        ) override {
            std::string dirname = path;
            if(dirname[dirname.length() - 1] != '/') {
                dirname += "/";
            }
            DIR* dir = opendir(dirname.c_str());
            if(dir == nullptr) {
                Logger::err("OS")
                    << "Could not open directory " << dirname
                    << std::endl;
#ifdef GEO_OS_ANDROID
		static bool first_time = true;
		if(first_time) {
		    Logger::err("OS")
			<< "You may need to grant the \"Storage\" permission"
			<< std::endl
			<< "to this application"
			<< std::endl;
		    Logger::err("OS")
			<< "(see Parameters/Applications"
			<< std::endl
			<< "in Android perferences)"
			<< std::endl;
		    first_time = false;
		}
#endif		
                return false;
            }
            struct dirent* entry = readdir(dir);
            while(entry != nullptr) {
                std::string current = std::string(entry->d_name);
                // Ignore . and ..
                if(current != "." && current != "..") {
                    if(dirname != "./") {
                        current = dirname + current;
                    }
                    // Ignore symbolic links and other special Unix stuff
                    if(is_file(current) || is_directory(current)) {
                        result.push_back(current);
                    }
                }
                entry = readdir(dir);
            }
            closedir(dir);
            return true;
        }